

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

void tt_interpolate_deltas
               (FT_Outline *outline,FT_Vector *out_points,FT_Vector *in_points,FT_Bool *has_delta)

{
  int p2;
  int iVar1;
  int ref2;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  FT_Pos *pFVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int p1;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (outline->n_contours != 0) {
    lVar7 = 0;
    uVar2 = 0;
    do {
      p2 = (int)outline->contours[lVar7];
      p1 = (int)uVar2;
      uVar13 = uVar2;
      if (p1 <= p2) {
        lVar10 = (long)p1;
        lVar12 = (long)p2;
        lVar4 = lVar10 << 0x20;
        lVar6 = 0;
        iVar1 = p1;
LAB_0017219a:
        iVar1 = iVar1 + 1;
        if (has_delta[lVar6 + lVar10] == '\0') goto code_r0x001721a0;
        uVar13 = uVar2 + lVar6 + 1;
        uVar2 = uVar2 + lVar6;
        ref2 = (int)uVar2;
        if (p2 <= ref2) goto LAB_001722be;
        lVar11 = (long)iVar1 + -1;
        uVar3 = uVar2 & 0xffffffff;
        uVar13 = (long)(int)uVar13;
        do {
          uVar14 = uVar13;
          if (has_delta[lVar11 + 1] != '\0') {
            tt_delta_interpolate
                      ((int)uVar3 + 1,(int)uVar2,(int)uVar3,(int)uVar14,in_points,out_points);
            uVar3 = uVar14 & 0xffffffff;
          }
          uVar13 = uVar14 + 1;
          lVar11 = lVar11 + 1;
          uVar2 = uVar14;
        } while (lVar11 < lVar12);
        iVar1 = (int)uVar3;
        if ((int)lVar6 + (p1 - iVar1) == 0) {
LAB_001722be:
          lVar8 = lVar4 >> 0x1c;
          lVar6 = *(long *)((long)&out_points->x + lVar8);
          lVar11 = *(long *)((long)&out_points->y + lVar8);
          lVar9 = *(long *)((long)&in_points->x + lVar8);
          lVar8 = *(long *)((long)&in_points->y + lVar8);
          if (lVar11 != lVar8 || lVar6 != lVar9) {
            lVar4 = lVar4 >> 0x20;
            lVar6 = lVar6 - lVar9;
            lVar11 = lVar11 - lVar8;
            if (p1 < ref2) {
              lVar9 = lVar4 - lVar10;
              pFVar5 = &out_points[lVar10].y;
              do {
                ((FT_Vector *)(pFVar5 + -1))->x = ((FT_Vector *)(pFVar5 + -1))->x + lVar6;
                *pFVar5 = *pFVar5 + lVar11;
                pFVar5 = pFVar5 + 2;
                lVar9 = lVar9 + -1;
              } while (lVar9 != 0);
            }
            if (ref2 < p2) {
              lVar12 = lVar12 - lVar4;
              pFVar5 = &out_points[lVar4 + 1].y;
              do {
                ((FT_Vector *)(pFVar5 + -1))->x = ((FT_Vector *)(pFVar5 + -1))->x + lVar6;
                *pFVar5 = *pFVar5 + lVar11;
                pFVar5 = pFVar5 + 2;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
          }
          goto LAB_00172357;
        }
        tt_delta_interpolate(iVar1 + 1,p2,iVar1,ref2,in_points,out_points);
        if (0 < lVar10 + lVar6) {
          tt_delta_interpolate(p1,p1 + (int)lVar6 + -1,iVar1,ref2,in_points,out_points);
        }
      }
LAB_00172357:
      lVar7 = lVar7 + 1;
      uVar2 = uVar13 & 0xffffffff;
    } while (lVar7 < outline->n_contours);
  }
  return;
code_r0x001721a0:
  lVar4 = lVar4 + 0x100000000;
  lVar11 = lVar10 + lVar6;
  lVar6 = lVar6 + 1;
  uVar13 = (ulong)(p2 + 1);
  if (lVar12 <= lVar11) goto LAB_00172357;
  goto LAB_0017219a;
}

Assistant:

static void
  tt_interpolate_deltas( FT_Outline*  outline,
                         FT_Vector*   out_points,
                         FT_Vector*   in_points,
                         FT_Bool*     has_delta )
  {
    FT_Int  first_point;
    FT_Int  end_point;

    FT_Int  first_delta;
    FT_Int  cur_delta;

    FT_Int    point;
    FT_Short  contour;


    /* ignore empty outlines */
    if ( !outline->n_contours )
      return;

    contour = 0;
    point   = 0;

    do
    {
      end_point   = outline->contours[contour];
      first_point = point;

      /* search first point that has a delta */
      while ( point <= end_point && !has_delta[point] )
        point++;

      if ( point <= end_point )
      {
        first_delta = point;
        cur_delta   = point;

        point++;

        while ( point <= end_point )
        {
          /* search next point that has a delta  */
          /* and interpolate intermediate points */
          if ( has_delta[point] )
          {
            tt_delta_interpolate( cur_delta + 1,
                                  point - 1,
                                  cur_delta,
                                  point,
                                  in_points,
                                  out_points );
            cur_delta = point;
          }

          point++;
        }

        /* shift contour if we only have a single delta */
        if ( cur_delta == first_delta )
          tt_delta_shift( first_point,
                          end_point,
                          cur_delta,
                          in_points,
                          out_points );
        else
        {
          /* otherwise handle remaining points       */
          /* at the end and beginning of the contour */
          tt_delta_interpolate( cur_delta + 1,
                                end_point,
                                cur_delta,
                                first_delta,
                                in_points,
                                out_points );

          if ( first_delta > 0 )
            tt_delta_interpolate( first_point,
                                  first_delta - 1,
                                  cur_delta,
                                  first_delta,
                                  in_points,
                                  out_points );
        }
      }
      contour++;

    } while ( contour < outline->n_contours );
  }